

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::~CodeGeneratorResponse
          (CodeGeneratorResponse *this)

{
  ~CodeGeneratorResponse(this);
  operator_delete(this);
  return;
}

Assistant:

CodeGeneratorResponse::~CodeGeneratorResponse() {
  // @@protoc_insertion_point(destructor:google.protobuf.compiler.CodeGeneratorResponse)
  SharedDtor();
}